

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Trivia __thiscall
slang::parsing::Preprocessor::handleResetAllDirective(Preprocessor *this,Token directive)

{
  Token directive_00;
  Token directive_01;
  undefined1 auVar1 [14];
  Info *in_RDX;
  undefined8 in_RSI;
  Preprocessor *in_RDI;
  Trivia TVar2;
  undefined8 local_58;
  undefined8 in_stack_ffffffffffffffb8;
  Info *in_stack_ffffffffffffffc0;
  undefined2 uStack_2;
  
  directive_00.info = in_stack_ffffffffffffffc0;
  directive_00._0_8_ = in_stack_ffffffffffffffb8;
  checkOutsideDesignElement(local_58,directive_00);
  resetAllDirectives(in_RDI);
  directive_01.info = in_RDX;
  directive_01._0_8_ = in_RSI;
  TVar2 = createSimpleDirective(local_58,directive_01);
  auVar1 = TVar2._0_14_;
  TVar2._14_2_ = uStack_2;
  TVar2.field_0 = (anon_union_12_4_39e54f29_for_Trivia_0)auVar1._0_12_;
  TVar2.hasFullLocation = (bool)auVar1[0xc];
  TVar2.kind = auVar1[0xd];
  return TVar2;
}

Assistant:

Trivia Preprocessor::handleResetAllDirective(Token directive) {
    checkOutsideDesignElement(directive);
    resetAllDirectives();
    return createSimpleDirective(directive);
}